

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

void readTxa<TxaHeaderPS3>(istream *stream,TxaHeader *header)

{
  pointer pTVar1;
  pointer src;
  size_t len;
  TxaChunk *chunk;
  pointer pTVar2;
  TxaChunkPS3 TVar3;
  vector<char,_std::allocator<char>_> buffer;
  TxaHeaderPS3 h;
  _Vector_base<char,_std::allocator<char>_> local_88;
  string local_70;
  TxaHeaderPS3 local_50;
  
  header->isSwitch = false;
  readRaw<TxaHeaderPS3>(&local_50,stream);
  header->indexed = (uint32_t)local_50.indexed.value_;
  header->largestDecodedChunk = (uint32_t)local_50.largestDecodedChunk.value_;
  header->indexSize = 0;
  std::vector<TxaChunk,_std::allocator<TxaChunk>_>::resize
            (&header->chunks,(ulong)(uint)local_50.chunks.value_);
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar1 = (header->chunks).super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar2 = (header->chunks).super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
    TVar3 = readRaw<TxaChunkPS3>(stream);
    pTVar2->index = (uint16_t)TVar3.index.value_.value_;
    pTVar2->width = (uint16_t)TVar3.width.value_.value_;
    pTVar2->height = (uint16_t)TVar3.height.value_.value_;
    pTVar2->offset = (uint32_t)TVar3.entryOffset.value_.value_;
    pTVar2->length = (uint32_t)TVar3.entryLength.value_.value_;
    pTVar2->decodedLength = 0;
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)&local_88,
               (ulong)(ushort)TVar3.headerLength.value_.value_ - 0xf);
    local_88._M_impl.super__Vector_impl_data._M_start
    [(ulong)(ushort)TVar3.headerLength.value_.value_ - 0x10] = '\0';
    std::istream::read((char *)stream,(long)local_88._M_impl.super__Vector_impl_data._M_start);
    src = local_88._M_impl.super__Vector_impl_data._M_start;
    len = strlen(local_88._M_impl.super__Vector_impl_data._M_start);
    toUTF8_abi_cxx11_(&local_70,src,len);
    std::__cxx11::string::operator=((string *)&pTVar2->name,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

void readTxa(std::istream& stream, TxaHeader& header) {
	header.isSwitch = Header::IsSwitch::value;
	Header h = readRaw<Header>(stream);
	header.indexed = h.indexed.value();
	header.largestDecodedChunk = h.largestDecodedChunk.value();
	header.indexSize = h.getIndexSize();
	header.chunks.resize(h.chunks.value());

	std::vector<char> buffer;

	for (auto& chunk : header.chunks) {
		auto c = readRaw<typename Header::Chunk>(stream);
		chunk.index = c.index.value();
		chunk.width = c.width.value();
		chunk.height = c.height.value();
		chunk.offset = c.entryOffset.value();
		chunk.length = c.entryLength.value();
		chunk.decodedLength = c.getDecLength();
		const size_t stringLength = c.headerLength.value() - sizeof(c);
		buffer.resize(stringLength + 1);
		buffer[stringLength] = 0;
		stream.read(buffer.data(), stringLength);
		chunk.name = toUTF8(buffer.data(), strlen(buffer.data()));
	}
}